

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O0

void __thiscall
OpenMD::RepulsivePower::getNRepulsionFunc
          (RepulsivePower *this,RealType *r,int *n,RealType *pot,RealType *deriv)

{
  double dVar1;
  __type_conflict *in_RCX;
  int *in_RDX;
  double *in_RSI;
  double *in_R8;
  __type_conflict _Var2;
  RealType rin1;
  RealType rin;
  RealType ri;
  int in_stack_ffffffffffffffbc;
  double in_stack_ffffffffffffffc0;
  
  dVar1 = *in_RSI;
  _Var2 = std::pow<double,int>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  *in_RCX = _Var2;
  *in_R8 = (double)-*in_RDX * _Var2 * (1.0 / dVar1);
  return;
}

Assistant:

void RepulsivePower::getNRepulsionFunc(const RealType& r, int& n,
                                         RealType& pot, RealType& deriv) {
    RealType ri   = 1.0 / r;
    RealType rin  = pow(ri, n);
    RealType rin1 = rin * ri;

    pot   = rin;
    deriv = -n * rin1;

    return;
  }